

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O2

void __thiscall HullLibrary::checkit(HullLibrary *this,cbtHullTriangle *t)

{
  return;
}

Assistant:

void HullLibrary::checkit(cbtHullTriangle *t)
{
	(void)t;

	int i;
	cbtAssert(m_tris[t->id] == t);
	for (i = 0; i < 3; i++)
	{
		int i1 = (i + 1) % 3;
		int i2 = (i + 2) % 3;
		int a = (*t)[i1];
		int b = (*t)[i2];

		// release compile fix
		(void)i1;
		(void)i2;
		(void)a;
		(void)b;

		cbtAssert(a != b);
		cbtAssert(m_tris[t->n[i]]->neib(b, a) == t->id);
	}
}